

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

int Curl_conn_cf_poll(Curl_cfilter *cf,Curl_easy *data,timediff_t timeout_ms)

{
  short sVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  uint nfds;
  pollfd pfds [5];
  easy_pollset ps;
  pollfd local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  easy_pollset local_38;
  
  local_38.sockets[0] = 0;
  local_38.sockets[1] = 0;
  local_38.sockets[2] = 0;
  local_38.sockets[3] = 0;
  local_38.sockets[4] = 0;
  local_38.num = 0;
  local_38.actions[0] = '\0';
  local_38.actions[1] = '\0';
  local_38.actions[2] = '\0';
  local_38.actions[3] = '\0';
  local_38.actions[4] = '\0';
  local_38._29_3_ = 0;
  local_68.fd = 0;
  local_68.events = 0;
  local_68.revents = 0;
  uStack_60 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_48 = 0;
  Curl_conn_cf_adjust_pollset(cf,data,&local_38);
  uVar2 = (ulong)local_38._16_8_ >> 0x20;
  if (uVar2 == 0) {
    nfds = 0;
  }
  else {
    uVar4 = 0;
    nfds = 0;
    do {
      sVar1 = (local_38.actions[uVar4] & 1) + (local_38.actions[uVar4] & 2) * 2;
      if ((char)sVar1 != '\0') {
        (&local_68)[nfds].fd = local_38.sockets[uVar4];
        (&local_68)[nfds].events = sVar1;
        nfds = nfds + 1;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  iVar3 = Curl_poll(&local_68,nfds,timeout_ms);
  return iVar3;
}

Assistant:

int Curl_conn_cf_poll(struct Curl_cfilter *cf,
                      struct Curl_easy *data,
                      timediff_t timeout_ms)
{
  struct easy_pollset ps;
  struct pollfd pfds[MAX_SOCKSPEREASYHANDLE];
  unsigned int i, npfds = 0;

  DEBUGASSERT(cf);
  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  memset(&ps, 0, sizeof(ps));
  memset(pfds, 0, sizeof(pfds));

  Curl_conn_cf_adjust_pollset(cf, data, &ps);
  DEBUGASSERT(ps.num <= MAX_SOCKSPEREASYHANDLE);
  for(i = 0; i < ps.num; ++i) {
    short events = 0;
    if(ps.actions[i] & CURL_POLL_IN) {
      events |= POLLIN;
    }
    if(ps.actions[i] & CURL_POLL_OUT) {
      events |= POLLOUT;
    }
    if(events) {
      pfds[npfds].fd = ps.sockets[i];
      pfds[npfds].events = events;
      ++npfds;
    }
  }

  if(!npfds)
    DEBUGF(infof(data, "no sockets to poll!"));
  return Curl_poll(pfds, npfds, timeout_ms);
}